

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  int iVar1;
  ostream *poVar2;
  Colour local_19 [8];
  Colour colour;
  
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam0000000000183570 = 0x7e7e7e7e7e7e7e;
    uRam0000000000183577 = 0x7e7e7e7e7e7e7e7e;
    _DAT_00183560 = 0x7e7e7e7e7e7e7e7e;
    uRam0000000000183568 = 0x7e7e7e7e7e7e7e;
    DAT_0018356f = 0x7e;
    _DAT_00183550 = 0x7e7e7e7e7e7e7e7e;
    uRam0000000000183558 = 0x7e7e7e7e7e7e7e7e;
    _DAT_00183540 = 0x7e7e7e7e7e7e7e7e;
    uRam0000000000183548 = 0x7e7e7e7e7e7e7e7e;
    _line = 0x7e7e7e7e7e7e7e7e;
    uRam0000000000183538 = 0x7e7e7e7e7e7e7e7e;
    DAT_0018357f = 0;
  }
  poVar2 = std::operator<<(poVar2,&getLineOfChars<(char)126>()::line);
  std::operator<<(poVar2,"\n");
  local_19[0].m_moved = false;
  Colour::use(FileName);
  poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                           (string *)
                           (this->super_StreamingReporterBase).currentTestRunInfo.
                           super_Option<Catch::TestRunInfo>.nullableValue);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  operator<<(poVar2,(Version *)libraryVersion);
  poVar2 = std::operator<<(poVar2," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xf])();
  if (iVar1 != 0) {
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,"Randomness seeded to: ");
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[0xf])();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n\n");
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(local_19);
  return;
}

Assistant:

void lazyPrintRunInfo() {
			stream << "\n" << getLineOfChars<'~'>() << "\n";
			Colour colour(Colour::SecondaryText);
			stream << currentTestRunInfo->name
				<< " is a Catch v" << libraryVersion << " host application.\n"
				<< "Run with -? for options\n\n";

			if (m_config->rngSeed() != 0)
				stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

			currentTestRunInfo.used = true;
		}